

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_xml.c
# Opt level: O1

void lydxml_get_hints_opaq
               (char *name,size_t name_len,char *value,size_t value_len,lyd_node *first,char *ns,
               uint32_t *hints,lyd_node **anchor)

{
  lyd_node *__s1;
  int iVar1;
  longlong lVar2;
  uint uVar3;
  int local_38 [2];
  
  *hints = 0;
  *anchor = (lyd_node *)0x0;
  if (value_len == 0) {
    uVar3 = 0x41;
  }
  else {
    iVar1 = strncmp(value,"true",value_len);
    uVar3 = 0x20;
    if ((iVar1 != 0) && (iVar1 = strncmp(value,"false",value_len), iVar1 != 0)) {
      lVar2 = strtoll(value,(char **)local_38,10);
      uVar3 = *hints;
      if ((uint)(local_38[0] - (int)value) == value_len) {
        *hints = uVar3 | 2;
        if (0xfffffffe7fffffff < lVar2 - 0x100000000U) goto LAB_00133fe7;
        uVar3 = uVar3 | 0x12;
      }
      else {
        uVar3 = uVar3 | 1;
      }
    }
  }
  *hints = uVar3;
LAB_00133fe7:
  if (first != (lyd_node *)0x0) {
    do {
      first = first->prev;
      if (first->schema == (lysc_node *)0x0) {
        if (*(int *)((long)&first[1].meta + 4) != 3) {
          __assert_fail("opaq->format == LY_VALUE_XML",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                        ,0x201,
                        "void lydxml_get_hints_opaq(const char *, size_t, const char *, size_t, const struct lyd_node *, const char *, uint32_t *, struct lyd_node **)"
                       );
        }
        iVar1 = ly_strncmp((char *)first[1].schema,name,name_len);
        if (iVar1 == 0) {
          __s1 = first[1].next;
          if (ns == (char *)0x0) {
            if (__s1 == (lyd_node *)0x0) goto LAB_00134043;
          }
          else if ((__s1 != (lyd_node *)0x0) && (iVar1 = strcmp((char *)__s1,ns), iVar1 == 0)) {
LAB_00134043:
            if ((first[1].prev == (lyd_node *)0x0) ||
               (uVar3 = 0x100, (char)(first[1].prev)->hash == '\0')) {
              uVar3 = 0x80;
            }
            *(uint *)&first[1].meta = *(uint *)&first[1].meta | uVar3;
            *hints = *hints | uVar3;
            *anchor = first;
            return;
          }
        }
      }
    } while (first->prev->next != (lyd_node *)0x0);
  }
  return;
}

Assistant:

static void
lydxml_get_hints_opaq(const char *name, size_t name_len, const char *value, size_t value_len, const struct lyd_node *first,
        const char *ns, uint32_t *hints, struct lyd_node **anchor)
{
    struct lyd_node_opaq *opaq;
    char *ptr;
    /* this needs to be at least 64bit, and it "should not" be an explicit int64_t
     * because the code calls strtoll later on, which "might" return a bigger type */
    long long num;

    *hints = 0;
    *anchor = NULL;

    if (!value_len) {
        /* no value but it may also be zero-length string */
        *hints |= LYD_VALHINT_EMPTY | LYD_VALHINT_STRING;
    } else if (!strncmp(value, "true", value_len) || !strncmp(value, "false", value_len)) {
        /* boolean value */
        *hints |= LYD_VALHINT_BOOLEAN;
    } else {
        num = strtoll(value, &ptr, 10);
        if ((unsigned)(ptr - value) == value_len) {
            /* number value */
            *hints |= LYD_VALHINT_DECNUM;
            if ((num < INT32_MIN) || (num > UINT32_MAX)) {
                /* large number */
                *hints |= LYD_VALHINT_NUM64;
            }
        } else {
            /* string value */
            *hints |= LYD_VALHINT_STRING;
        }
    }

    if (!first) {
        return;
    }

    /* search backwards to find the last instance */
    do {
        first = first->prev;
        if (first->schema) {
            continue;
        }

        opaq = (struct lyd_node_opaq *)first;
        assert(opaq->format == LY_VALUE_XML);
        if (!ly_strncmp(opaq->name.name, name, name_len) &&
                ((ns && opaq->name.module_ns && !strcmp(opaq->name.module_ns, ns)) || (!ns && !opaq->name.module_ns))) {
            if (opaq->value && opaq->value[0]) {
                /* leaf-list nodes */
                opaq->hints |= LYD_NODEHINT_LEAFLIST;
                *hints |= LYD_NODEHINT_LEAFLIST;
            } else {
                /* list nodes */
                opaq->hints |= LYD_NODEHINT_LIST;
                *hints |= LYD_NODEHINT_LIST;
            }
            *anchor = (struct lyd_node *)first;
            break;
        }
    } while (first->prev->next);
}